

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_s32__mulaw(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint32 dVar1;
  ulong samplesToRead_00;
  drwav_uint64 sampleCount;
  drwav_uint64 dVar2;
  uchar sampleData [4096];
  drwav_uint8 local_1038 [4104];
  
  dVar1 = drwav_get_bytes_per_sample(pWav);
  if (dVar1 == 0) {
    dVar2 = 0;
  }
  else {
    dVar2 = 0;
    for (; samplesToRead != 0; samplesToRead = samplesToRead - sampleCount) {
      samplesToRead_00 = 0x1000 / (ulong)dVar1;
      if (samplesToRead < 0x1000 / (ulong)dVar1) {
        samplesToRead_00 = samplesToRead;
      }
      sampleCount = drwav_read(pWav,samplesToRead_00,local_1038);
      if (sampleCount == 0) {
        return dVar2;
      }
      drwav_mulaw_to_s32(pBufferOut,local_1038,sampleCount);
      pBufferOut = pBufferOut + sampleCount;
      dVar2 = dVar2 + sampleCount;
    }
  }
  return dVar2;
}

Assistant:

drwav_uint64 drwav_read_s32__mulaw(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_mulaw_to_s32(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}